

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qmenu.cpp
# Opt level: O1

void QMenu::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  ushort uVar1;
  long *plVar2;
  byte *pbVar3;
  QArrayData *pQVar4;
  undefined8 uVar5;
  QIcon QVar6;
  byte bVar7;
  undefined8 *puVar8;
  QIcon *pQVar9;
  int iVar10;
  QObject *pQVar11;
  long in_FS_OFFSET;
  QIcon moved;
  QIcon local_60;
  QIcon local_58;
  QIcon *pQStack_50;
  undefined8 local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c);
  pQVar11 = _o;
  switch(_id) {
  case 0:
    goto LAB_004678d0;
  case 1:
    iVar10 = 1;
    goto LAB_004678d2;
  case 2:
    local_60.d = *_a[1];
    pQStack_50 = &local_60;
    pQVar9 = &local_58;
    local_58.d = (QIconPrivate *)0x0;
    iVar10 = 2;
    goto LAB_004678d4;
  case 3:
    local_60.d = *_a[1];
    pQStack_50 = &local_60;
    pQVar9 = &local_58;
    local_58.d = (QIconPrivate *)0x0;
    iVar10 = 3;
    goto LAB_004678d4;
  case 4:
    internalDelayedPopup((QMenu *)_o);
    break;
  case 5:
    QMenuPrivate::_q_actionTriggered(*(QMenuPrivate **)(_o + 8));
    break;
  case 6:
    QMenuPrivate::_q_actionHovered(*(QMenuPrivate **)(_o + 8));
    break;
  case 7:
    *(undefined8 *)(*(long *)(_o + 8) + 0x3a8) = *(undefined8 *)(*(long *)(_o + 8) + 0x3b0);
    break;
  case 8:
    pQVar11 = *(QObject **)(*(long *)(_o + 8) + 8);
LAB_004678d0:
    iVar10 = 0;
LAB_004678d2:
    pQVar9 = (QIcon *)0x0;
LAB_004678d4:
    QMetaObject::activate(pQVar11,&staticMetaObject,iVar10,&pQVar9->d);
  }
  switch(_c) {
  case ReadProperty:
switchD_004677d4_caseD_1:
    if (4 < (uint)_id) goto LAB_00467a7a;
    pbVar3 = (byte *)*_a;
    switch(_id) {
    case 0:
      *pbVar3 = (byte)((ushort)*(undefined2 *)(*(long *)(_o + 8) + 0x420) >> 9) & 1;
      break;
    case 1:
      QAction::text();
      pQVar4 = *(QArrayData **)pbVar3;
      *(QIconPrivate **)pbVar3 = local_58.d;
      pQVar9 = *(QIcon **)(pbVar3 + 8);
      *(QIcon **)(pbVar3 + 8) = pQStack_50;
      uVar5 = *(undefined8 *)(pbVar3 + 0x10);
      *(undefined8 *)(pbVar3 + 0x10) = local_48;
      local_58.d = (QIconPrivate *)pQVar4;
      pQStack_50 = pQVar9;
      local_48 = uVar5;
      if (pQVar4 != (QArrayData *)0x0) {
        LOCK();
        (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar4,2,0x10);
        }
      }
      break;
    case 2:
      QAction::icon();
      QVar6.d = local_60.d;
      local_60.d = (QIconPrivate *)0x0;
      local_58.d = *(QIconPrivate **)pbVar3;
      *(QIconPrivate **)pbVar3 = QVar6.d;
      QIcon::~QIcon(&local_58);
      QIcon::~QIcon(&local_60);
      break;
    case 3:
      bVar7 = *(byte *)(*(long *)(_o + 8) + 0x420) >> 3;
      goto LAB_00467a74;
    case 4:
      bVar7 = *(byte *)(*(long *)(_o + 8) + 0x420) >> 4;
LAB_00467a74:
      *pbVar3 = bVar7 & 1;
    }
LAB_00467a7a:
    if (_c != WriteProperty) goto switchD_004677d4_caseD_3;
    break;
  case WriteProperty:
    break;
  default:
    goto switchD_004677d4_caseD_3;
  case IndexOfMethod:
switchD_004677d4_caseD_5:
    plVar2 = (long *)_a[1];
    if (((code *)*plVar2 == aboutToShow) && (plVar2[1] == 0)) {
      *(undefined4 *)*_a = 0;
      goto switchD_004677d4_caseD_3;
    }
    if (((code *)*plVar2 == aboutToHide) && (plVar2[1] == 0)) {
      *(undefined4 *)*_a = 1;
      goto switchD_004677d4_caseD_3;
    }
    if (((code *)*plVar2 == triggered) && (plVar2[1] == 0)) {
      *(undefined4 *)*_a = 2;
      goto switchD_004677d4_caseD_3;
    }
    if (((code *)*plVar2 == hovered) && (plVar2[1] == 0)) {
      *(undefined4 *)*_a = 3;
      goto switchD_004677d4_caseD_3;
    }
    if (_c != WriteProperty) {
      if (_c != ReadProperty) goto switchD_004677d4_caseD_3;
      goto switchD_004677d4_caseD_1;
    }
    break;
  case RegisterMethodArgumentMetaType:
    if ((_id == 2) || (_id == 3)) {
      puVar8 = (undefined8 *)*_a;
      if (*_a[1] != 0) goto LAB_0046791c;
      *puVar8 = &QtPrivate::QMetaTypeInterfaceWrapper<QAction_*>::metaType;
    }
    else {
      puVar8 = (undefined8 *)*_a;
LAB_0046791c:
      *puVar8 = 0;
    }
    if (_c == ReadProperty) goto switchD_004677d4_caseD_1;
    if (_c != WriteProperty) {
      if (_c != IndexOfMethod) goto switchD_004677d4_caseD_3;
      goto switchD_004677d4_caseD_5;
    }
  }
  if ((uint)_id < 5) {
    pbVar3 = (byte *)*_a;
    switch(_id) {
    case 0:
      setTearOffEnabled((QMenu *)_o,(bool)*pbVar3);
      break;
    case 1:
      QAction::setText(*(QString **)(*(long *)(_o + 8) + 0x3a8));
      break;
    case 2:
      QAction::setIcon(*(QIcon **)(*(long *)(_o + 8) + 0x3a8));
      break;
    case 3:
      setSeparatorsCollapsible((QMenu *)_o,(bool)*pbVar3);
      break;
    case 4:
      uVar1 = *(ushort *)(*(long *)(_o + 8) + 0x420);
      if (((uVar1 & 0x10) == 0) == (bool)*pbVar3) {
        *(ushort *)(*(long *)(_o + 8) + 0x420) = uVar1 & 0xffef | (ushort)*pbVar3 << 4;
      }
    }
  }
switchD_004677d4_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMenu::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QMenu *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->aboutToShow(); break;
        case 1: _t->aboutToHide(); break;
        case 2: _t->triggered((*reinterpret_cast< std::add_pointer_t<QAction*>>(_a[1]))); break;
        case 3: _t->hovered((*reinterpret_cast< std::add_pointer_t<QAction*>>(_a[1]))); break;
        case 4: _t->internalDelayedPopup(); break;
        case 5: _t->d_func()->_q_actionTriggered(); break;
        case 6: _t->d_func()->_q_actionHovered(); break;
        case 7: _t->d_func()->_q_overrideMenuActionDestroyed(); break;
        case 8: _t->d_func()->_q_platformMenuAboutToShow(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 2:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QAction* >(); break;
            }
            break;
        case 3:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QAction* >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QMenu::*)()>(_a, &QMenu::aboutToShow, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QMenu::*)()>(_a, &QMenu::aboutToHide, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QMenu::*)(QAction * )>(_a, &QMenu::triggered, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QMenu::*)(QAction * )>(_a, &QMenu::hovered, 3))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<bool*>(_v) = _t->isTearOffEnabled(); break;
        case 1: *reinterpret_cast<QString*>(_v) = _t->title(); break;
        case 2: *reinterpret_cast<QIcon*>(_v) = _t->icon(); break;
        case 3: *reinterpret_cast<bool*>(_v) = _t->separatorsCollapsible(); break;
        case 4: *reinterpret_cast<bool*>(_v) = _t->toolTipsVisible(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setTearOffEnabled(*reinterpret_cast<bool*>(_v)); break;
        case 1: _t->setTitle(*reinterpret_cast<QString*>(_v)); break;
        case 2: _t->setIcon(*reinterpret_cast<QIcon*>(_v)); break;
        case 3: _t->setSeparatorsCollapsible(*reinterpret_cast<bool*>(_v)); break;
        case 4: _t->setToolTipsVisible(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}